

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O0

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,int i)

{
  string local_38;
  int local_14;
  Pipeline *pPStack_10;
  int i_local;
  Pipeline *this_local;
  
  local_14 = i;
  pPStack_10 = this;
  std::__cxx11::to_string(&local_38,i);
  writeString(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(int i)
{
    this->writeString(std::to_string(i));
    return *this;
}